

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall cmSearchPath::AddCMakePrefixPath(cmSearchPath *this,string *variable)

{
  pointer pbVar1;
  char *base;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  char *value;
  string *variable_local;
  cmSearchPath *this_local;
  
  if (this->FC != (cmFindCommon *)0x0) {
    expanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmMakefile::GetDefinition((this->FC->super_cmCommand).Makefile,variable);
    if (expanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
      pbVar1 = expanded.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,(char *)pbVar1,&local_59);
      cmSystemTools::ExpandListArgument
                (&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,false);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      base = cmMakefile::GetCurrentSourceDirectory((this->FC->super_cmCommand).Makefile);
      AddPrefixPaths(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,base);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    }
    return;
  }
  __assert_fail("this->FC != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSearchPath.cxx"
                ,0x80,"void cmSearchPath::AddCMakePrefixPath(const std::string &)");
}

Assistant:

void cmSearchPath::AddCMakePrefixPath(const std::string& variable)
{
  assert(this->FC != NULL);

  // Get a path from a CMake variable.
  if(const char* value = this->FC->Makefile->GetDefinition(variable))
    {
    std::vector<std::string> expanded;
    cmSystemTools::ExpandListArgument(value, expanded);

    this->AddPrefixPaths(expanded,
                         this->FC->Makefile->GetCurrentSourceDirectory());
    }
}